

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O3

sexp_conflict
sexp_blocker(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict portorfd,
            sexp_conflict timeout)

{
  sexp psVar1;
  ushort uVar2;
  sexp_tag_t sVar3;
  sexp_conflict psVar4;
  sexp_conflict *ppsVar5;
  sexp_conflict psVar6;
  sexp_conflict psVar7;
  ulong uVar8;
  sexp_conflict *ppsVar9;
  
  if (((ulong)portorfd & 3) == 0) {
    if (portorfd->tag - 0x10 < 2) {
      psVar1 = (portorfd->value).type.getters;
      if (psVar1 == (sexp)0x0) {
        psVar1 = (portorfd->value).type.slots;
        if ((((ulong)psVar1 & 3) != 0) || (psVar1->tag != 0x12)) goto LAB_00102e36;
        sVar3 = (psVar1->value).promise.donep;
      }
      else {
        sVar3 = fileno((FILE *)psVar1);
      }
    }
    else {
      if (portorfd->tag != 0x12) goto LAB_00102ca0;
      sVar3 = (portorfd->value).promise.donep;
    }
  }
  else {
LAB_00102ca0:
    if (((ulong)portorfd & 1) == 0) {
      psVar4 = (sexp_conflict)sexp_type_exception(ctx,self,0x10,portorfd);
      return psVar4;
    }
    sVar3 = (sexp_tag_t)((ulong)portorfd >> 1);
  }
  if ((int)sVar3 < 0) goto LAB_00102e36;
  uVar2 = 1;
  if (((ulong)portorfd & 3) == 0) {
    uVar2 = (ushort)(portorfd->tag == 0x11) * 3 + 1;
  }
  psVar1 = (ctx->value).type.setters;
  ppsVar5 = (psVar1->value).context.mark_stack[0xb].end;
  if (ppsVar5 == (sexp_conflict *)0x0 || ((ulong)ppsVar5 & 3) != 0) {
    uVar8 = (long)(psVar1->value).context.mark_stack[0xc].prev >> 1;
LAB_00102d82:
    ppsVar5 = (sexp_conflict *)sexp_alloc_tagged_aux(ctx,0x20,uVar8);
    psVar4 = (sexp_conflict)malloc(0x80);
    ppsVar9 = ppsVar5 + 1;
    ppsVar5[1] = psVar4;
    ppsVar5[2] = (sexp_conflict)0x0;
    ppsVar5[3] = (sexp_conflict)0x10;
    (((ctx->value).type.setters)->value).context.mark_stack[0xb].end = ppsVar5;
    psVar4 = ppsVar5[1];
LAB_00102dc3:
    psVar6 = (sexp_conflict)0x0;
    psVar7 = (sexp_conflict)0x0;
  }
  else {
    uVar8 = (long)(psVar1->value).context.mark_stack[0xc].prev >> 1;
    if (uVar8 != *(uint *)ppsVar5) goto LAB_00102d82;
    psVar4 = ppsVar5[1];
    psVar6 = ppsVar5[2];
    ppsVar9 = ppsVar5 + 1;
    if (psVar6 == (sexp_conflict)0x0) goto LAB_00102dc3;
    psVar7 = (sexp_conflict)0x0;
    do {
      if ((&psVar4->tag)[(long)psVar7 * 2] == sVar3) {
        *(ushort *)(&psVar4->markedp + (long)psVar7 * 8) =
             *(ushort *)(&psVar4->markedp + (long)psVar7 * 8) | uVar2;
        goto LAB_00102e36;
      }
      psVar7 = (sexp_conflict)((long)&psVar7->tag + 1);
    } while (psVar6 != psVar7);
    psVar7 = (sexp_conflict)(ulong)(uint)((int)psVar6 * 2);
  }
  if (psVar6 == ppsVar5[3]) {
    ppsVar5[3] = psVar7;
    psVar6 = (sexp_conflict)malloc((long)psVar7 << 3);
    *ppsVar9 = psVar6;
    if (psVar6 != (sexp_conflict)0x0) {
      memcpy(psVar6,psVar4,(long)psVar7 << 3);
    }
    free(psVar4);
    psVar4 = *ppsVar9;
    psVar6 = ppsVar5[2];
  }
  ppsVar5[2] = (sexp_conflict)((long)&psVar6->tag + 1);
  (&psVar4->tag)[(long)psVar6 * 2] = sVar3;
  *(ushort *)(&psVar4->markedp + (long)psVar6 * 8) = uVar2;
LAB_00102e36:
  (ctx->value).flonum_bits[0x60a3] = '\x01';
  (ctx->value).opcode.dl = portorfd;
  sexp_insert_timed(ctx,ctx,timeout);
  return (sexp_conflict)0x43e;
}

Assistant:

sexp sexp_blocker (sexp ctx, sexp self, sexp_sint_t n, sexp portorfd, sexp timeout) {
  int fd;
  /* register the fd */
  if (sexp_portp(portorfd))
    fd = sexp_port_fileno(portorfd);
  else if (sexp_filenop(portorfd))
    fd = sexp_fileno_fd(portorfd);
  else if (sexp_fixnump(portorfd))
    fd = sexp_unbox_fixnum(portorfd);
  else
    return sexp_type_exception(ctx, self, SEXP_IPORT, portorfd);
  if (fd >= 0)
    sexp_insert_pollfd(ctx, fd, sexp_oportp(portorfd) ? POLLOUT : POLLIN);
  /* pause the current thread */
  sexp_context_waitp(ctx) = 1;
  sexp_context_event(ctx) = portorfd;
  sexp_insert_timed(ctx, ctx, timeout);
  return SEXP_VOID;
}